

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O1

void av1_setup_frame(AV1_COMP *cpi)

{
  AV1_COMMON *cm;
  FRAME_TYPE FVar1;
  uint uVar2;
  SequenceHeader *pSVar3;
  BLOCK_SIZE BVar4;
  RefCntBuffer *pRVar5;
  int iVar6;
  
  cm = &cpi->common;
  if (((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
      ((cpi->common).features.error_resilient_mode != false)) ||
     ((cpi->ext_flags).use_primary_ref_none == true)) {
    av1_setup_past_independence(cm);
  }
  FVar1 = (cm->current_frame).frame_type;
  if ((FVar1 == '\x03') || ((FVar1 == '\0' && ((cpi->common).show_frame != 0)))) {
    if (cpi->ppi->seq_params_locked == 0) {
      pSVar3 = (cpi->common).seq_params;
      BVar4 = av1_select_sb_size(&cpi->oxcf,(cpi->common).width,(cpi->common).height,
                                 cpi->ppi->number_spatial_layers);
      pSVar3->sb_size = BVar4;
      pSVar3->mib_size =
           (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar4]
      ;
      pSVar3->mib_size_log2 = (uint)""[BVar4];
    }
  }
  else {
    uVar2 = (cpi->common).features.primary_ref_frame;
    if (uVar2 == 7) {
LAB_001c1564:
      pRVar5 = (RefCntBuffer *)0x0;
    }
    else {
      iVar6 = -1;
      if ((uVar2 & 0xf8) == 0) {
        iVar6 = (cpi->common).remapped_ref_idx[uVar2 & 7];
      }
      if (iVar6 == -1) goto LAB_001c1564;
      pRVar5 = (cpi->common).ref_frame_map[iVar6];
    }
    if (pRVar5 == (RefCntBuffer *)0x0) {
      av1_setup_past_independence(cm);
      (cpi->common).seg.update_map = '\x01';
      (cpi->common).seg.update_data = '\x01';
    }
    else {
      memcpy((cpi->common).fc,&pRVar5->frame_context,0x52fc);
    }
  }
  pRVar5 = (cpi->common).cur_frame;
  pRVar5->interp_filter_selected[0] = 0;
  pRVar5->interp_filter_selected[1] = 0;
  pRVar5->interp_filter_selected[2] = 0;
  pRVar5->interp_filter_selected[3] = 0;
  uVar2 = (cpi->common).features.primary_ref_frame;
  if (uVar2 != 7) {
    iVar6 = -1;
    if ((uVar2 & 0xf8) == 0) {
      iVar6 = (cpi->common).remapped_ref_idx[uVar2 & 7];
    }
    if (iVar6 != -1) {
      pRVar5 = (cpi->common).ref_frame_map[iVar6];
      goto LAB_001c15da;
    }
  }
  pRVar5 = (RefCntBuffer *)0x0;
LAB_001c15da:
  (cpi->common).prev_frame = pRVar5;
  cpi->vaq_refresh = 0;
  return;
}

Assistant:

void av1_setup_frame(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  // Set up entropy context depending on frame type. The decoder mandates
  // the use of the default context, index 0, for keyframes and inter
  // frames where the error_resilient_mode or intra_only flag is set. For
  // other inter-frames the encoder currently uses only two contexts;
  // context 1 for ALTREF frames and context 0 for the others.

  if (frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
      cpi->ext_flags.use_primary_ref_none) {
    av1_setup_past_independence(cm);
  }

  if ((cm->current_frame.frame_type == KEY_FRAME && cm->show_frame) ||
      frame_is_sframe(cm)) {
    if (!cpi->ppi->seq_params_locked) {
      set_sb_size(cm->seq_params,
                  av1_select_sb_size(&cpi->oxcf, cm->width, cm->height,
                                     cpi->ppi->number_spatial_layers));
    }
  } else {
    const RefCntBuffer *const primary_ref_buf = get_primary_ref_frame_buf(cm);
    if (primary_ref_buf == NULL) {
      av1_setup_past_independence(cm);
      cm->seg.update_map = 1;
      cm->seg.update_data = 1;
    } else {
      *cm->fc = primary_ref_buf->frame_context;
    }
  }

  av1_zero(cm->cur_frame->interp_filter_selected);
  cm->prev_frame = get_primary_ref_frame_buf(cm);
  cpi->vaq_refresh = 0;
}